

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O0

void RecDblWrd(GmfMshSct *msh,void *wrd)

{
  size_t sVar1;
  void *in_RSI;
  long in_RDI;
  
  sVar1 = fwrite(in_RSI,4,2,*(FILE **)(in_RDI + 0x300410));
  if (sVar1 != 2) {
    longjmp((__jmp_buf_tag *)(in_RDI + 0x48),-0x1d);
  }
  return;
}

Assistant:

static void RecDblWrd(GmfMshSct *msh, const void *wrd)
{
   // [Bruno] added error control
#ifdef WITH_GMF_AIO
   if(write(msh->FilDes, wrd, WrdSiz * 2) != WrdSiz*2)
#else
   if(fwrite(wrd, WrdSiz, 2, msh->hdl) != 2)
#endif
      longjmp(msh->err,-29);
}